

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evdevPlus.cpp
# Opt level: O3

ssize_t __thiscall
evdevPlus::EventDevice::read(EventDevice *this,int __fd,void *__buf,size_t __nbytes)

{
  int __v;
  ssize_t sVar1;
  system_error *this_00;
  int *piVar2;
  error_category *__ecat;
  undefined4 in_register_00000034;
  
  *(undefined8 *)this = 0;
  (this->path_)._M_dataplus._M_p = (pointer)0x0;
  (this->path_)._M_string_length = 0;
  (this->path_).field_2._M_allocated_capacity = (size_type)this;
  *(size_type **)((long)&(this->path_).field_2 + 8) = &(this->path_)._M_string_length;
  *(undefined1 **)&this->DriverVersion = (undefined1 *)((long)&(this->path_)._M_string_length + 2);
  (this->DeviceID).inputId = (input_id)((long)&(this->path_)._M_string_length + 4);
  sVar1 = ::read(*(int *)CONCAT44(in_register_00000034,__fd),this,0x18);
  if (sVar1 == 0x18) {
    return (ssize_t)this;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x20);
  piVar2 = __errno_location();
  __v = *piVar2;
  __ecat = (error_category *)std::_V2::system_category();
  if (sVar1 < 0) {
    std::system_error::system_error(this_00,__v,__ecat,"read");
  }
  else {
    std::system_error::system_error(this_00,__v,__ecat,"truncated read");
  }
  __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

InputEvent EventDevice::read() {
	InputEvent ret;

	ssize_t rc = ::read(fd_, &ret.event, sizeof(input_event));

	if (rc != sizeof(input_event)) {
		if (rc < 0)
			throw std::system_error(errno, std::system_category(), "read");
		else
			throw std::system_error(errno, std::system_category(), "truncated read");
	}

	return ret;
}